

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> __thiscall
QDockAreaLayoutInfo::takeWidgetItem(QDockAreaLayoutInfo *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QList<int> *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> *widgetItem;
  QList<int> path;
  _Head_base<0UL,_QLayoutItem_*,_false> this_00;
  QDockAreaLayoutInfo *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->sep = (int *)&DAT_aaaaaaaaaaaaaaaa;
  this_00._M_head_impl = (QLayoutItem *)in_RDI;
  this_01 = in_RDI;
  std::unique_ptr<QLayoutItem,std::default_delete<QLayoutItem>>::
  unique_ptr<std::default_delete<QLayoutItem>,void>
            ((unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> *)in_RDI);
  indexOf((QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
  bVar2 = QList<int>::isEmpty((QList<int> *)0x572961);
  if (!bVar2) {
    item(this_01,in_RSI);
    std::unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_>::reset
              ((unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> *)this_00._M_head_impl,
               (pointer)in_RDI);
  }
  QList<int>::~QList((QList<int> *)0x57298a);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QLayoutItem,_std::default_delete<QLayoutItem>,_true,_true>)
         (tuple<QLayoutItem_*,_std::default_delete<QLayoutItem>_>)this_00._M_head_impl;
}

Assistant:

std::unique_ptr<QLayoutItem> QDockAreaLayoutInfo::takeWidgetItem(QWidget *widget)
{
    std::unique_ptr<QLayoutItem> widgetItem;
    if (const auto path = indexOf(widget); !path.isEmpty())
        widgetItem.reset(item(path).widgetItem);
    return widgetItem;
}